

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMesh::AddNode(ChMesh *this,shared_ptr<chrono::fea::ChNodeFEAbase> *m_node)

{
  element_type *peVar1;
  ChSystem *pCVar2;
  
  peVar1 = (m_node->super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (*peVar1->_vptr_ChNodeFEAbase[4])
            (peVar1,(ulong)((int)((ulong)((long)(this->vnodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->vnodes).
                                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4) + 1)
            );
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
  ::push_back(&this->vnodes,m_node);
  pCVar2 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
  if (pCVar2 != (ChSystem *)0x0) {
    pCVar2->is_initialized = false;
    pCVar2->is_updated = false;
  }
  return;
}

Assistant:

void ChMesh::AddNode(std::shared_ptr<ChNodeFEAbase> m_node) {
    m_node->SetIndex(static_cast<unsigned int>(vnodes.size()) + 1);
    vnodes.push_back(m_node);

    // If the mesh is already added to a system, mark the system uninitialized and out-of-date
    if (system) {
        system->is_initialized = false;
        system->is_updated = false;
    }
}